

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<kj::Array<unsigned_char>_> *
kj::parse::
Many_<kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexByte>,_true>
::Impl<capnp::compiler::Lexer::ParserInput,_unsigned_char>::apply
          (Maybe<kj::Array<unsigned_char>_> *__return_storage_ptr__,
          Transform_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexByte>
          *subParser,ParserInput *input)

{
  ArrayDisposer *pAVar1;
  ArrayDisposer *pAVar2;
  char cVar3;
  Maybe<kj::Array<unsigned_char>_> *pMVar4;
  NullableValue<unsigned_char> _subResult425;
  ParserInput subInput;
  Results results;
  undefined1 local_94 [20];
  ArrayDisposer *pAStack_80;
  ArrayDisposer *local_78;
  ArrayDisposer *local_70;
  char *local_68;
  ArrayBuilder<unsigned_char> local_58;
  
  local_58.ptr = (uchar *)0x0;
  local_58.pos = (uchar *)0x0;
  local_58.endPtr = (uchar *)0x0;
  local_58.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_94._4_8_ = __return_storage_ptr__;
  do {
    pAVar1 = (ArrayDisposer *)(input->super_IteratorInput<char,_const_char_*>).pos;
    pAVar2 = (ArrayDisposer *)(input->super_IteratorInput<char,_const_char_*>).end;
    if (pAVar1 == pAVar2) break;
    local_68 = input->begin;
    local_94._12_8_ = input;
    pAStack_80 = pAVar1;
    local_78 = pAVar2;
    local_70 = pAVar1;
    Transform_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexByte>
    ::operator()<capnp::compiler::Lexer::ParserInput>
              ((Transform_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexByte>
                *)local_94,(ParserInput *)subParser);
    cVar3 = local_94[0];
    local_94[2] = local_94[0];
    if (local_94[0] == '\x01') {
      local_94[3] = local_94[1];
      ((IteratorInput<char,_const_char_*> *)local_94._12_8_)->pos = (char *)pAStack_80;
      Vector<unsigned_char>::add<unsigned_char>((Vector<unsigned_char> *)&local_58,local_94 + 3);
    }
    IteratorInput<char,_const_char_*>::~IteratorInput
              ((IteratorInput<char,_const_char_*> *)(local_94 + 0xc));
  } while (cVar3 != '\0');
  if (local_58.pos == local_58.ptr) {
    ((NullableValue<kj::Array<unsigned_char>_> *)local_94._4_8_)->isSet = false;
    pMVar4 = (Maybe<kj::Array<unsigned_char>_> *)local_94._4_8_;
  }
  else {
    Vector<unsigned_char>::releaseAsArray
              ((Array<unsigned_char> *)(local_94 + 0xc),(Vector<unsigned_char> *)&local_58);
    pMVar4 = (Maybe<kj::Array<unsigned_char>_> *)local_94._4_8_;
    ((NullableValue<kj::Array<unsigned_char>_> *)local_94._4_8_)->isSet = true;
    (((NullableValue<kj::Array<unsigned_char>_> *)local_94._4_8_)->field_1).value.ptr =
         (uchar *)local_94._12_8_;
    (((NullableValue<kj::Array<unsigned_char>_> *)local_94._4_8_)->field_1).value.size_ =
         (size_t)pAStack_80;
    (((NullableValue<kj::Array<unsigned_char>_> *)local_94._4_8_)->field_1).value.disposer =
         local_78;
    local_94._12_8_ = (ParserInput *)0x0;
    pAStack_80 = (ArrayDisposer *)0x0;
    Array<unsigned_char>::~Array((Array<unsigned_char> *)(local_94 + 0xc));
  }
  ArrayBuilder<unsigned_char>::dispose(&local_58);
  return pMVar4;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_SOME(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(subResult));
      } else {
        break;
      }
    }